

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O2

Array<asl::String> * __thiscall
asl::Map<asl::String,_asl::Array<asl::String>_>::operator[]
          (Map<asl::String,_asl::Array<asl::String>_> *this,String *key)

{
  uint k;
  Array<asl::String> AStack_48;
  KeyVal local_40;
  
  k = indexOf(this,key);
  if ((int)k < 0) {
    Array<asl::String>::Array(&AStack_48);
    KeyVal::KeyVal(&local_40,key,&AStack_48);
    k = ~k;
    Array<asl::Map<asl::String,_asl::Array<asl::String>_>::KeyVal>::insert(&this->a,k,&local_40);
    KeyVal::~KeyVal(&local_40);
    Array<asl::String>::~Array(&AStack_48);
  }
  return &(this->a)._a[k].value;
}

Assistant:

T& Map<K,T>::operator[](const K& key)
{
	int i = indexOf(key);
	if(i >= 0)
		return a[i].value;
	else
	{
		a.insert(-i-1, KeyVal(key, T()));
		return a[-i-1].value;
	}
}